

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O1

void __thiscall jpgd::jpeg_decoder::transform_mcu(jpeg_decoder *this,int mcu_row)

{
  undefined1 uVar1;
  jpgd_block_coeff_t *pjVar2;
  uint8 *puVar3;
  undefined1 uVar4;
  int iVar5;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int *piVar10;
  int *pDst_ptr;
  jpgd_block_coeff_t *pInput;
  short *pSrc;
  undefined1 *puVar11;
  long lVar12;
  int *pOutputUB;
  int local_138 [66];
  uint uVar6;
  
  lVar12 = (long)mcu_row * (long)this->m_blocks_per_mcu;
  if (this->m_max_blocks_per_row <= (int)lVar12) {
    stop_decoding(this,JPGD_DECODE_ERROR);
  }
  if (0 < this->m_blocks_per_mcu) {
    pjVar2 = this->m_pMCU_coefficients;
    puVar3 = this->m_pSample_buf;
    pOutputUB = (int *)(puVar3 + lVar12 * 0x40);
    lVar12 = 0;
    pInput = pjVar2;
    do {
      iVar9 = this->m_mcu_block_max_zag[lVar12];
      if (iVar9 < 1) {
        __assert_fail("block_max_zag >= 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/3rdparty/jpeg-compressor/jpgd.cpp"
                      ,0x11f,"void jpgd::idct(const jpgd_block_coeff_t *, uint8 *, int, bool)");
      }
      if (0x40 < iVar9) {
        __assert_fail("block_max_zag <= 64",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/3rdparty/jpeg-compressor/jpgd.cpp"
                      ,0x120,"void jpgd::idct(const jpgd_block_coeff_t *, uint8 *, int, bool)");
      }
      if (iVar9 == 1) {
        iVar5 = *pInput + 4 >> 3;
        iVar9 = 0;
        if (-0x81 < iVar5) {
          iVar9 = 0xff;
        }
        if ((char)iVar5 == iVar5) {
          iVar9 = iVar5 + 0x80;
        }
        uVar7 = 9;
        piVar10 = pOutputUB;
        do {
          *piVar10 = iVar9 * 0x1010101;
          piVar10[1] = iVar9 * 0x1010101;
          piVar10 = piVar10 + 2;
          uVar7 = uVar7 - 1;
        } while (1 < uVar7);
      }
      else if (((this->m_flags & 2) == 0 & this->m_has_sse2) == 0) {
        puVar11 = s_idct_row_table + (ulong)(iVar9 - 1) * 8;
        uVar7 = 9;
        piVar10 = local_138;
        pSrc = pInput;
        do {
          switch(*puVar11) {
          case 1:
            iVar5 = (int)*pSrc << 2;
            *piVar10 = iVar5;
            piVar10[1] = iVar5;
            piVar10[2] = iVar5;
            piVar10[3] = iVar5;
            piVar10[4] = iVar5;
            piVar10[5] = iVar5;
            piVar10[6] = iVar5;
            piVar10[7] = iVar5;
            break;
          case 2:
            Row<2>::idct(piVar10,pSrc);
            break;
          case 3:
            Row<3>::idct(piVar10,pSrc);
            break;
          case 4:
            Row<4>::idct(piVar10,pSrc);
            break;
          case 5:
            Row<5>::idct(piVar10,pSrc);
            break;
          case 6:
            Row<6>::idct(piVar10,pSrc);
            break;
          case 7:
            Row<7>::idct(piVar10,pSrc);
            break;
          case 8:
            Row<8>::idct(piVar10,pSrc);
          }
          pSrc = pSrc + 8;
          piVar10 = piVar10 + 8;
          puVar11 = puVar11 + 1;
          uVar7 = uVar7 - 1;
        } while (1 < uVar7);
        uVar1 = s_idct_col_table[iVar9 - 1];
        uVar7 = 9;
        piVar10 = local_138;
        pDst_ptr = pOutputUB;
        do {
          switch(uVar1) {
          case 1:
            uVar8 = *piVar10 + 0x1010 >> 5;
            uVar6 = (uint)(byte)-(-0x1011 < *piVar10);
            if (uVar8 < 0x100) {
              uVar6 = uVar8;
            }
            uVar4 = (undefined1)uVar6;
            *(undefined1 *)pDst_ptr = uVar4;
            *(undefined1 *)(pDst_ptr + 2) = uVar4;
            *(undefined1 *)(pDst_ptr + 4) = uVar4;
            *(undefined1 *)(pDst_ptr + 6) = uVar4;
            *(undefined1 *)(pDst_ptr + 8) = uVar4;
            *(undefined1 *)(pDst_ptr + 10) = uVar4;
            *(undefined1 *)(pDst_ptr + 0xc) = uVar4;
            *(undefined1 *)(pDst_ptr + 0xe) = uVar4;
            break;
          case 2:
            Col<2>::idct((uint8 *)pDst_ptr,piVar10);
            break;
          case 3:
            Col<3>::idct((uint8 *)pDst_ptr,piVar10);
            break;
          case 4:
            Col<4>::idct((uint8 *)pDst_ptr,piVar10);
            break;
          case 5:
            Col<5>::idct((uint8 *)pDst_ptr,piVar10);
            break;
          case 6:
            Col<6>::idct((uint8 *)pDst_ptr,piVar10);
            break;
          case 7:
            Col<7>::idct((uint8 *)pDst_ptr,piVar10);
            break;
          case 8:
            Col<8>::idct((uint8 *)pDst_ptr,piVar10);
          }
          piVar10 = piVar10 + 1;
          pDst_ptr = (int *)((long)pDst_ptr + 1);
          uVar7 = uVar7 - 1;
        } while (1 < uVar7);
      }
      else {
        if (((ulong)pjVar2 & 0xf) != 0) {
          __assert_fail("(((uintptr_t)pSrc_ptr) & 15) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/3rdparty/jpeg-compressor/jpgd.cpp"
                        ,0x135,"void jpgd::idct(const jpgd_block_coeff_t *, uint8 *, int, bool)");
        }
        if (((ulong)puVar3 & 0xf) != 0) {
          __assert_fail("(((uintptr_t)pDst_ptr) & 15) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/3rdparty/jpeg-compressor/jpgd.cpp"
                        ,0x136,"void jpgd::idct(const jpgd_block_coeff_t *, uint8 *, int, bool)");
        }
        idctSSEShortU8(pInput,(uint8_t *)pOutputUB);
      }
      pInput = pInput + 0x40;
      pOutputUB = pOutputUB + 0x10;
      lVar12 = lVar12 + 1;
    } while (lVar12 < this->m_blocks_per_mcu);
  }
  return;
}

Assistant:

void jpeg_decoder::transform_mcu(int mcu_row)
	{
		jpgd_block_coeff_t* pSrc_ptr = m_pMCU_coefficients;
		if (mcu_row * m_blocks_per_mcu >= m_max_blocks_per_row)
			stop_decoding(JPGD_DECODE_ERROR);

		uint8* pDst_ptr = m_pSample_buf + mcu_row * m_blocks_per_mcu * 64;

		for (int mcu_block = 0; mcu_block < m_blocks_per_mcu; mcu_block++)
		{
			idct(pSrc_ptr, pDst_ptr, m_mcu_block_max_zag[mcu_block], ((m_flags & cFlagDisableSIMD) == 0) && m_has_sse2);
			pSrc_ptr += 64;
			pDst_ptr += 64;
		}
	}